

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::DGXMLScanner::scanStartTag(DGXMLScanner *this,bool *gotData)

{
  Grammar *pGVar1;
  XMLValidator *pXVar2;
  XMLDocumentHandler *pXVar3;
  DTDAttDef *pDVar4;
  XMLAttDef *pXVar5;
  XMLElementDecl *text1;
  bool bVar6;
  int iVar7;
  uint uVar8;
  XMLCh *pXVar9;
  undefined4 extraout_var;
  DTDElementDecl *pDVar10;
  XMLSize_t XVar11;
  QName *child;
  XMLReader *pXVar12;
  XMLAttr *this_00;
  undefined4 extraout_var_00;
  UnexpectedEOFException *this_01;
  undefined4 extraout_var_01;
  undefined8 in_stack_fffffffffffffea8;
  undefined4 uVar13;
  AttTypes local_104;
  undefined1 local_a0 [7];
  bool res;
  XMLSize_t failure;
  uint *puStack_90;
  uint uriId;
  uint *curCountPtr;
  XMLCh *attrValue;
  XMLAttr *curAtt;
  DTDAttDef *pDStack_70;
  XMLCh chFound_1;
  XMLAttDef *attDef;
  XMLCh *namePtr;
  XMLCh chFound;
  XMLSize_t XStack_58;
  XMLCh nextCh;
  XMLSize_t curAttListSize;
  XMLSize_t attCount;
  DTDElementDecl *local_38;
  XMLElementDecl *elemDecl;
  XMLCh *qnameRawBuf;
  bool wasAdded;
  bool isRoot;
  bool isEmpty;
  bool *pbStack_20;
  bool validName;
  bool *gotData_local;
  DGXMLScanner *this_local;
  
  *gotData = true;
  pbStack_20 = gotData;
  gotData_local = (bool *)this;
  qnameRawBuf._7_1_ =
       ReaderMgr::getName(&(this->super_XMLScanner).fReaderMgr,&(this->super_XMLScanner).fQNameBuf);
  if (!(bool)qnameRawBuf._7_1_) {
    bVar6 = XMLBuffer::isEmpty(&(this->super_XMLScanner).fQNameBuf);
    if (bVar6) {
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedElementName);
    }
    else {
      pXVar9 = XMLBuffer::getRawBuffer(&(this->super_XMLScanner).fQNameBuf);
      XMLScanner::emitError
                (&this->super_XMLScanner,InvalidElementName,pXVar9,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    ReaderMgr::skipToChar(&(this->super_XMLScanner).fReaderMgr,L'<');
    return false;
  }
  qnameRawBuf._6_1_ = 0;
  qnameRawBuf._5_1_ = ElemStack::isEmpty(&(this->super_XMLScanner).fElemStack);
  qnameRawBuf._4_1_ = 0;
  elemDecl = (XMLElementDecl *)XMLBuffer::getRawBuffer(&(this->super_XMLScanner).fQNameBuf);
  pGVar1 = (this->super_XMLScanner).fGrammar;
  iVar7 = (*(pGVar1->super_XSerializable)._vptr_XSerializable[0xb])
                    (pGVar1,(ulong)(this->super_XMLScanner).fEmptyNamespaceId,0,elemDecl,0xfffffffe)
  ;
  local_38 = (DTDElementDecl *)CONCAT44(extraout_var,iVar7);
  if (local_38 == (DTDElementDecl *)0x0) {
    local_38 = NameIdPool<xercesc_4_0::DTDElementDecl>::getByKey
                         (this->fDTDElemNonDeclPool,(XMLCh *)elemDecl);
  }
  if (local_38 == (DTDElementDecl *)0x0) {
    qnameRawBuf._4_1_ = 1;
    pDVar10 = (DTDElementDecl *)XMemory::operator_new(0x58,(this->super_XMLScanner).fMemoryManager);
    DTDElementDecl::DTDElementDecl
              (pDVar10,(XMLCh *)elemDecl,(this->super_XMLScanner).fEmptyNamespaceId,Any,
               (this->super_XMLScanner).fMemoryManager);
    local_38 = pDVar10;
    XVar11 = NameIdPool<xercesc_4_0::DTDElementDecl>::put(this->fDTDElemNonDeclPool,pDVar10);
    XMLElementDecl::setId((XMLElementDecl *)pDVar10,XVar11);
  }
  if (((this->super_XMLScanner).fValidate & 1U) != 0) {
    if ((qnameRawBuf._4_1_ & 1) == 0) {
      bVar6 = XMLElementDecl::isDeclared(&local_38->super_XMLElementDecl);
      if (!bVar6) {
        XMLValidator::emitError
                  ((this->super_XMLScanner).fValidator,ElementNotDefined,(XMLCh *)elemDecl,
                   (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      }
    }
    else {
      XMLElementDecl::setCreateReason(&local_38->super_XMLElementDecl,JustFaultIn);
      XMLValidator::emitError
                ((this->super_XMLScanner).fValidator,ElementNotDefined,(XMLCh *)elemDecl,
                 (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
    pXVar2 = (this->super_XMLScanner).fValidator;
    (*pXVar2->_vptr_XMLValidator[9])(pXVar2,local_38);
  }
  pDVar10 = local_38;
  XVar11 = ReaderMgr::getCurrentReaderNum(&(this->super_XMLScanner).fReaderMgr);
  ElemStack::addLevel(&(this->super_XMLScanner).fElemStack,&pDVar10->super_XMLElementDecl,XVar11);
  if ((qnameRawBuf._5_1_ & 1) == 0) {
    if (((this->super_XMLScanner).fValidate & 1U) != 0) {
      child = XMLElementDecl::getElementName(&local_38->super_XMLElementDecl);
      ElemStack::addChild(&(this->super_XMLScanner).fElemStack,child,true);
    }
  }
  else {
    (this->super_XMLScanner).fRootGrammar = (this->super_XMLScanner).fGrammar;
    if (((((this->super_XMLScanner).fValidate & 1U) != 0) &&
        ((this->super_XMLScanner).fRootElemName != (XMLCh *)0x0)) &&
       (bVar6 = XMLString::equals((XMLCh *)elemDecl,(this->super_XMLScanner).fRootElemName), !bVar6)
       ) {
      XMLValidator::emitError((this->super_XMLScanner).fValidator,RootElemNotLikeDocType);
    }
  }
  ReaderMgr::skipPastSpaces(&(this->super_XMLScanner).fReaderMgr);
  curAttListSize = 0;
  XStack_58 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::size
                        (&((this->super_XMLScanner).fAttrList)->
                          super_BaseRefVectorOf<xercesc_4_0::XMLAttr>);
  qnameRawBuf._4_1_ = 0;
  this->fElemCount = this->fElemCount + 1;
LAB_0034101e:
  namePtr._6_2_ = ReaderMgr::peekNextChar(&(this->super_XMLScanner).fReaderMgr);
  if (((curAttListSize != 0) && (namePtr._6_2_ != L'/')) && (namePtr._6_2_ != L'>')) {
    pXVar12 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
    bVar6 = XMLReader::isWhitespace(pXVar12,namePtr._6_2_);
    if (bVar6) {
      ReaderMgr::skipPastSpaces(&(this->super_XMLScanner).fReaderMgr);
      namePtr._6_2_ = ReaderMgr::peekNextChar(&(this->super_XMLScanner).fReaderMgr);
    }
    else {
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedWhitespace);
    }
  }
  pXVar12 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
  bVar6 = XMLReader::isSpecialStartTagChar(pXVar12,namePtr._6_2_);
  uVar13 = (undefined4)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  if (!bVar6) {
    qnameRawBuf._7_1_ =
         ReaderMgr::getName(&(this->super_XMLScanner).fReaderMgr,
                            &(this->super_XMLScanner).fAttNameBuf);
    if (!(bool)qnameRawBuf._7_1_) {
      bVar6 = XMLBuffer::isEmpty(&(this->super_XMLScanner).fAttNameBuf);
      if (bVar6) {
        XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
      }
      else {
        pXVar9 = XMLBuffer::getRawBuffer(&(this->super_XMLScanner).fAttNameBuf);
        XMLScanner::emitError
                  (&this->super_XMLScanner,InvalidAttrName,pXVar9,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
      }
      ReaderMgr::skipPastChar(&(this->super_XMLScanner).fReaderMgr,L'>');
      return false;
    }
    bVar6 = XMLScanner::scanEq(&this->super_XMLScanner,false);
    if (!bVar6) goto code_r0x00341198;
    goto LAB_0034125e;
  }
  if (namePtr._6_2_ == L'\0') {
    this_01 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
    UnexpectedEOFException::UnexpectedEOFException
              (this_01,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
               ,0x582,Gen_UnexpectedEOF,(this->super_XMLScanner).fMemoryManager);
    __cxa_throw(this_01,&UnexpectedEOFException::typeinfo,
                UnexpectedEOFException::~UnexpectedEOFException);
  }
  if (namePtr._6_2_ == L'/') {
    ReaderMgr::getNextChar(&(this->super_XMLScanner).fReaderMgr);
    qnameRawBuf._6_1_ = 1;
    bVar6 = ReaderMgr::skippedChar(&(this->super_XMLScanner).fReaderMgr,L'>');
    if (!bVar6) {
      pXVar9 = XMLElementDecl::getFullName(&local_38->super_XMLElementDecl);
      XMLScanner::emitError
                (&this->super_XMLScanner,UnterminatedStartTag,pXVar9,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
  }
  else if (namePtr._6_2_ == L'>') {
    ReaderMgr::getNextChar(&(this->super_XMLScanner).fReaderMgr);
  }
  else {
    if (namePtr._6_2_ != L'<') {
      if ((namePtr._6_2_ == L'\'') || (namePtr._6_2_ == L'\"')) {
        XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
        ReaderMgr::getNextChar(&(this->super_XMLScanner).fReaderMgr);
        ReaderMgr::skipQuotedString(&(this->super_XMLScanner).fReaderMgr,namePtr._6_2_);
        ReaderMgr::skipPastSpaces(&(this->super_XMLScanner).fReaderMgr);
      }
      goto LAB_0034101e;
    }
    pXVar9 = XMLElementDecl::getFullName(&local_38->super_XMLElementDecl);
    XMLScanner::emitError
              (&this->super_XMLScanner,UnterminatedStartTag,pXVar9,(XMLCh *)0x0,(XMLCh *)0x0,
               (XMLCh *)0x0);
  }
  if (curAttListSize != 0) {
    Hash2KeysSetOf<xercesc_4_0::StringHasher>::removeAll(this->fUndeclaredAttrRegistry);
  }
  curAttListSize =
       buildAttList(this,curAttListSize,&local_38->super_XMLElementDecl,
                    (this->super_XMLScanner).fAttrList);
  failure._4_4_ = (this->super_XMLScanner).fEmptyNamespaceId;
  if ((this->super_XMLScanner).fDocHandler != (XMLDocumentHandler *)0x0) {
    pXVar3 = (this->super_XMLScanner).fDocHandler;
    (*pXVar3->_vptr_XMLDocumentHandler[0xb])
              (pXVar3,local_38,(ulong)failure._4_4_,0,(this->super_XMLScanner).fAttrList,
               curAttListSize,CONCAT44(uVar13,(uint)(qnameRawBuf._6_1_ & 1)),
               (uint)(qnameRawBuf._5_1_ & 1));
  }
  if ((qnameRawBuf._6_1_ & 1) != 0) {
    if ((((this->super_XMLScanner).fValidate & 1U) != 0) &&
       (pXVar2 = (this->super_XMLScanner).fValidator,
       uVar8 = (*pXVar2->_vptr_XMLValidator[2])(pXVar2,local_38,0,0,local_a0), text1 = elemDecl,
       (uVar8 & 1) == 0)) {
      pXVar2 = (this->super_XMLScanner).fValidator;
      iVar7 = (*(local_38->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[0xd])();
      XMLValidator::emitError
                (pXVar2,ElementNotValidForContent,(XMLCh *)text1,
                 (XMLCh *)CONCAT44(extraout_var_01,iVar7),(XMLCh *)0x0,(XMLCh *)0x0);
    }
    ElemStack::popTop(&(this->super_XMLScanner).fElemStack);
    if ((qnameRawBuf._5_1_ & 1) != 0) {
      *pbStack_20 = false;
    }
  }
  return true;
code_r0x00341198:
  XMLScanner::emitError(&this->super_XMLScanner,ExpectedEqSign);
  namePtr._4_2_ = ReaderMgr::skipUntilInOrWS(&(this->super_XMLScanner).fReaderMgr,L"\'\"></");
  if ((namePtr._4_2_ != L'>') && (namePtr._4_2_ != L'/')) {
    if ((namePtr._4_2_ != L'\'') && (namePtr._4_2_ != L'\"')) {
      pXVar12 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
      bVar6 = XMLReader::isWhitespace(pXVar12,namePtr._4_2_);
      if (!bVar6) {
        if (namePtr._4_2_ != L'<') {
          return false;
        }
        pXVar9 = XMLElementDecl::getFullName(&local_38->super_XMLElementDecl);
        XMLScanner::emitError
                  (&this->super_XMLScanner,UnterminatedStartTag,pXVar9,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
        return false;
      }
    }
LAB_0034125e:
    attDef = (XMLAttDef *)XMLBuffer::getRawBuffer(&(this->super_XMLScanner).fAttNameBuf);
    pDStack_70 = DTDElementDecl::getAttDef(local_38,(XMLCh *)attDef);
    ReaderMgr::skipPastSpaces(&(this->super_XMLScanner).fReaderMgr);
    bVar6 = scanAttValue(this,&pDStack_70->super_XMLAttDef,(XMLCh *)attDef,
                         &(this->super_XMLScanner).fAttValueBuf);
    if (!bVar6) {
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrValue);
      curAtt._6_2_ = ReaderMgr::skipUntilInOrWS(&(this->super_XMLScanner).fReaderMgr,L"></");
      if ((curAtt._6_2_ != L'>') && (curAtt._6_2_ != L'/')) {
        pXVar12 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
        bVar6 = XMLReader::isWhitespace(pXVar12,curAtt._6_2_);
        if (!bVar6) {
          if (curAtt._6_2_ != L'<') {
            return false;
          }
          pXVar9 = XMLElementDecl::getFullName(&local_38->super_XMLElementDecl);
          XMLScanner::emitError
                    (&this->super_XMLScanner,UnterminatedStartTag,pXVar9,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
          return false;
        }
      }
    }
    curCountPtr = (uint *)XMLBuffer::getRawBuffer(&(this->super_XMLScanner).fAttValueBuf);
    if (curAttListSize < XStack_58) {
      attrValue = (XMLCh *)BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                                     (&((this->super_XMLScanner).fAttrList)->
                                       super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,curAttListSize);
    }
    else {
      this_00 = (XMLAttr *)XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager);
      XMLAttr::XMLAttr(this_00,(this->super_XMLScanner).fMemoryManager);
      attrValue = (XMLCh *)this_00;
      BaseRefVectorOf<xercesc_4_0::XMLAttr>::addElement
                (&((this->super_XMLScanner).fAttrList)->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,
                 this_00);
    }
    XMLAttr::setSpecified((XMLAttr *)attrValue,true);
    pXVar5 = attDef;
    pXVar9 = attrValue;
    if (pDStack_70 == (DTDAttDef *)0x0) {
      local_104 = AttTypes_Min;
    }
    else {
      local_104 = XMLAttDef::getType(&pDStack_70->super_XMLAttDef);
    }
    in_stack_fffffffffffffea8 = 0;
    XMLAttr::set((XMLAttr *)pXVar9,0,(XMLCh *)pXVar5,L"",L"",local_104,(DatatypeValidator *)0x0,
                 false);
    if (pDStack_70 == (DTDAttDef *)0x0) {
      attDef = (XMLAttDef *)XMLAttr::getQName((XMLAttr *)attrValue);
      bVar6 = Hash2KeysSetOf<xercesc_4_0::StringHasher>::putIfNotPresent
                        (this->fUndeclaredAttrRegistry,attDef,0);
      pXVar5 = attDef;
      if (!bVar6) {
        pXVar9 = XMLElementDecl::getFullName(&local_38->super_XMLElementDecl);
        XMLScanner::emitError
                  (&this->super_XMLScanner,AttrAlreadyUsedInSTag,(XMLCh *)pXVar5,pXVar9,(XMLCh *)0x0
                   ,(XMLCh *)0x0);
      }
    }
    else {
      puStack_90 = RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::get
                             (this->fAttDefRegistry,pDStack_70);
      if (puStack_90 == (uint *)0x0) {
        puStack_90 = XMLScanner::getNewUIntPtr(&this->super_XMLScanner);
        *puStack_90 = this->fElemCount;
        RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::put
                  (this->fAttDefRegistry,pDStack_70,puStack_90);
      }
      else if (*puStack_90 < this->fElemCount) {
        *puStack_90 = this->fElemCount;
      }
      else {
        iVar7 = (*(pDStack_70->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])();
        pXVar9 = XMLElementDecl::getFullName(&local_38->super_XMLElementDecl);
        XMLScanner::emitError
                  (&this->super_XMLScanner,AttrAlreadyUsedInSTag,
                   (XMLCh *)CONCAT44(extraout_var_00,iVar7),pXVar9,(XMLCh *)0x0,(XMLCh *)0x0);
      }
    }
    pDVar4 = pDStack_70;
    if (((this->super_XMLScanner).fValidate & 1U) != 0) {
      if (pDStack_70 == (DTDAttDef *)0x0) {
        pXVar2 = (this->super_XMLScanner).fValidator;
        pXVar9 = XMLBuffer::getRawBuffer(&(this->super_XMLScanner).fAttNameBuf);
        XMLValidator::emitError
                  (pXVar2,AttNotDefinedForElement,pXVar9,(XMLCh *)elemDecl,(XMLCh *)0x0,(XMLCh *)0x0
                  );
      }
      else {
        pXVar2 = (this->super_XMLScanner).fValidator;
        pXVar9 = XMLBuffer::getRawBuffer(&(this->super_XMLScanner).fAttValueBuf);
        (*pXVar2->_vptr_XMLValidator[8])(pXVar2,pDVar4,pXVar9,0,local_38);
      }
    }
    XMLAttr::setValue((XMLAttr *)attrValue,(XMLCh *)curCountPtr);
    curAttListSize = curAttListSize + 1;
  }
  goto LAB_0034101e;
}

Assistant:

bool DGXMLScanner::scanStartTag(bool& gotData)
{
    //  Assume we will still have data until proven otherwise. It will only
    //  ever be false if this is the root and its empty.
    gotData = true;

    //  Get the QName. In this case, we are not doing namespaces, so we just
    //  use it as is and don't have to break it into parts.

    bool validName = fReaderMgr.getName(fQNameBuf);
    if (!validName)
    {
        if (fQNameBuf.isEmpty())
            emitError(XMLErrs::ExpectedElementName);
        else
            emitError(XMLErrs::InvalidElementName, fQNameBuf.getRawBuffer());
        fReaderMgr.skipToChar(chOpenAngle);
        return false;
    }

    // Assume it won't be an empty tag
    bool isEmpty = false;

    // See if its the root element
    const bool isRoot = fElemStack.isEmpty();

    //  Lets try to look up the element in the validator's element decl pool
    //  We can pass bogus values for the URI id and the base name. We know that
    //  this can only be called if we are doing a DTD style validator and that
    //  he will only look at the QName.
    //
    //  We *do not* tell him to fault in a decl if he does not find one - NG.
    bool wasAdded = false;
    const XMLCh* qnameRawBuf = fQNameBuf.getRawBuffer();

    XMLElementDecl* elemDecl = fGrammar->getElemDecl
    (
        fEmptyNamespaceId
        , 0
        , qnameRawBuf
        , Grammar::TOP_LEVEL_SCOPE
    );
    // look in the undeclared pool:
    if(!elemDecl)
    {
        elemDecl = fDTDElemNonDeclPool->getByKey(qnameRawBuf);
    }
    if(!elemDecl)
    {
        wasAdded = true;
        elemDecl = new (fMemoryManager) DTDElementDecl
        (
            qnameRawBuf
            , fEmptyNamespaceId
            , DTDElementDecl::Any
            , fMemoryManager
        );
        elemDecl->setId(fDTDElemNonDeclPool->put((DTDElementDecl*)elemDecl));
    }

    if (fValidate) {

        if (wasAdded)
        {
            // This is to tell the reuse Validator that this element was
            // faulted-in, was not an element in the validator pool originally
            elemDecl->setCreateReason(XMLElementDecl::JustFaultIn);

            fValidator->emitError
            (
                XMLValid::ElementNotDefined
                , qnameRawBuf
            );
        }
        // If its not marked declared, then emit an error
        else if (!elemDecl->isDeclared())
        {
            fValidator->emitError
            (
                XMLValid::ElementNotDefined
                , qnameRawBuf
            );
        }


        fValidator->validateElement(elemDecl);
    }

    // Expand the element stack and add the new element
    fElemStack.addLevel(elemDecl, fReaderMgr.getCurrentReaderNum());

    //  If this is the first element and we are validating, check the root
    //  element.
    if (isRoot)
    {
        fRootGrammar = fGrammar;

        if (fValidate)
        {
            //  If a DocType exists, then check if it matches the root name there.
            if (fRootElemName && !XMLString::equals(qnameRawBuf, fRootElemName))
                fValidator->emitError(XMLValid::RootElemNotLikeDocType);
        }
    }
    else if (fValidate)
    {
        //  If the element stack is not empty, then add this element as a
        //  child of the previous top element. If its empty, this is the root
        //  elem and is not the child of anything.
        fElemStack.addChild(elemDecl->getElementName(), true);
    }

    // Skip any whitespace after the name
    fReaderMgr.skipPastSpaces();

    //  We loop until we either see a /> or >, handling attribute/value
    //  pairs until we get there.
    XMLSize_t    attCount = 0;
    XMLSize_t    curAttListSize = fAttrList->size();
    wasAdded = false;

    fElemCount++;

    while (true)
    {
        // And get the next non-space character
        XMLCh nextCh = fReaderMgr.peekNextChar();

        //  If the next character is not a slash or closed angle bracket,
        //  then it must be whitespace, since whitespace is required
        //  between the end of the last attribute and the name of the next
        //  one.
        if (attCount)
        {
            if ((nextCh != chForwardSlash) && (nextCh != chCloseAngle))
            {
                if (fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                {
                    // Ok, skip by them and peek another char
                    fReaderMgr.skipPastSpaces();
                    nextCh = fReaderMgr.peekNextChar();
                }
                 else
                {
                    // Emit the error but keep on going
                    emitError(XMLErrs::ExpectedWhitespace);
                }
            }
        }

        //  Ok, here we first check for any of the special case characters.
        //  If its not one, then we do the normal case processing, which
        //  assumes that we've hit an attribute value, Otherwise, we do all
        //  the special case checks.
        if (!fReaderMgr.getCurrentReader()->isSpecialStartTagChar(nextCh))
        {
            //  Assume its going to be an attribute, so get a name from
            //  the input.

            validName = fReaderMgr.getName(fAttNameBuf);
            if (!validName)
            {
                if (fAttNameBuf.isEmpty())
                    emitError(XMLErrs::ExpectedAttrName);
                else
                    emitError(XMLErrs::InvalidAttrName, fAttNameBuf.getRawBuffer());
                fReaderMgr.skipPastChar(chCloseAngle);
                return false;
            }

            // And next must be an equal sign
            if (!scanEq())
            {
                static const XMLCh tmpList[] =
                {
                    chSingleQuote, chDoubleQuote, chCloseAngle
                    , chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedEqSign);

                //  Try to sync back up by skipping forward until we either
                //  hit something meaningful.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle) || (chFound == chForwardSlash))
                {
                    // Jump back to top for normal processing of these
                    continue;
                }
                else if ((chFound == chSingleQuote)
                      ||  (chFound == chDoubleQuote)
                      ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    // Just fall through assuming that the value is to follow
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }

            //  See if this attribute is declared for this element. If we are
            //  not validating of course it will not be at first, but we will
            //  fault it into the pool (to avoid lots of redundant errors.)
            XMLCh * namePtr = fAttNameBuf.getRawBuffer();
            XMLAttDef* attDef = ((DTDElementDecl *)elemDecl)->getAttDef(namePtr);

            //  Skip any whitespace before the value and then scan the att
            //  value. This will come back normalized with entity refs and
            //  char refs expanded.
            fReaderMgr.skipPastSpaces();
            if (!scanAttValue(attDef, namePtr, fAttValueBuf))
            {
                static const XMLCh tmpList[] =
                {
                    chCloseAngle, chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedAttrValue);

                //  It failed, so lets try to get synced back up. We skip
                //  forward until we find some whitespace or one of the
                //  chars in our list.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle)
                ||  (chFound == chForwardSlash)
                ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    //  Just fall through and process this attribute, though
                    //  the value will be "".
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }

            //  Add this attribute to the attribute list that we use to
            //  pass them to the handler. We reuse its existing elements
            //  but expand it as required.
            // Note that we want to this first since this will
            // make a copy of the namePtr; we can then make use of
            // that copy in the hashtable lookup that checks
            // for duplicates.  This will mean we may have to update
            // the type of the XMLAttr later.
            XMLAttr* curAtt;
            const XMLCh* attrValue = fAttValueBuf.getRawBuffer();

            if (attCount >= curAttListSize) {
                curAtt = new (fMemoryManager) XMLAttr(fMemoryManager);
                fAttrList->addElement(curAtt);
            }
            else {
                curAtt = fAttrList->elementAt(attCount);
            }

            curAtt->setSpecified(true);

            // NO NAMESPACE CODE
            {
                curAtt->set(
                    0, namePtr, XMLUni::fgZeroLenString, XMLUni::fgZeroLenString
                    , (attDef)?attDef->getType():XMLAttDef::CData
                );

                // now need to prepare for duplicate detection
                if (attDef) {
                    unsigned int *curCountPtr = fAttDefRegistry->get(attDef);
                    if (!curCountPtr) {
                        curCountPtr = getNewUIntPtr();
                        *curCountPtr = fElemCount;
                        fAttDefRegistry->put(attDef, curCountPtr);
                    }
                    else if (*curCountPtr < fElemCount) {
                        *curCountPtr = fElemCount;
                    }
                    else {
                        emitError(
                            XMLErrs::AttrAlreadyUsedInSTag
                            , attDef->getFullName(), elemDecl->getFullName()
                        );
                    }
                }
                else
                {
                    // reset namePtr so it refers to newly-allocated memory
                    namePtr = (XMLCh *)curAtt->getQName();
                    if (!fUndeclaredAttrRegistry->putIfNotPresent(namePtr, 0))
                    {
                        emitError(
                            XMLErrs::AttrAlreadyUsedInSTag
                            , namePtr, elemDecl->getFullName()
                        );
                    }
                }
            }

            if (fValidate)
            {
                if (attDef) {
                    // Let the validator pass judgement on the attribute value
                    fValidator->validateAttrValue(
                        attDef, fAttValueBuf.getRawBuffer(), false, elemDecl
                    );
                }
                else
                {
                    fValidator->emitError
                    (
                        XMLValid::AttNotDefinedForElement
                        , fAttNameBuf.getRawBuffer(), qnameRawBuf
                    );
                }
            }

            // must set the newly-minted value on the XMLAttr:
            curAtt->setValue(attrValue);
            attCount++;

            // And jump back to the top of the loop
            continue;
        }

        //  It was some special case character so do all of the checks and
        //  deal with it.
        if (!nextCh)
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);

        if (nextCh == chForwardSlash)
        {
            fReaderMgr.getNextChar();
            isEmpty = true;
            if (!fReaderMgr.skippedChar(chCloseAngle))
                emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
            break;
        }
        else if (nextCh == chCloseAngle)
        {
            fReaderMgr.getNextChar();
            break;
        }
        else if (nextCh == chOpenAngle)
        {
            //  Check for this one specially, since its going to be common
            //  and it is kind of auto-recovering since we've already hit the
            //  next open bracket, which is what we would have seeked to (and
            //  skipped this whole tag.)
            emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
            break;
        }
        else if ((nextCh == chSingleQuote) || (nextCh == chDoubleQuote))
        {
            //  Check for this one specially, which is probably a missing
            //  attribute name, e.g. ="value". Just issue expected name
            //  error and eat the quoted string, then jump back to the
            //  top again.
            emitError(XMLErrs::ExpectedAttrName);
            fReaderMgr.getNextChar();
            fReaderMgr.skipQuotedString(nextCh);
            fReaderMgr.skipPastSpaces();
            continue;
        }
    }

    if(attCount)
    {
        // clean up after ourselves:
        // clear the map used to detect duplicate attributes
        fUndeclaredAttrRegistry->removeAll();
    }

    //  Now lets get the fAttrList filled in. This involves faulting in any
    //  defaulted and fixed attributes and normalizing the values of any that
    //  we got explicitly.
    //
    //  We update the attCount value with the total number of attributes, but
    //  it goes in with the number of values we got during the raw scan of
    //  explictly provided attrs above.
    attCount = buildAttList(attCount, elemDecl, *fAttrList);

    //  If we have a document handler, then tell it about this start tag. We
    //  don't have any URI id to send along, so send fEmptyNamespaceId. We also do not send
    //  any prefix since its just one big name if we are not doing namespaces.
    unsigned int uriId = fEmptyNamespaceId;
    if (fDocHandler)
    {
        fDocHandler->startElement
        (
            *elemDecl
            , uriId
            , 0
            , *fAttrList
            , attCount
            , isEmpty
            , isRoot
        );
    }

    //  If empty, validate content right now if we are validating and then
    //  pop the element stack top. Else, we have to update the current stack
    //  top's namespace mapping elements.
    if (isEmpty)
    {
        // If validating, then insure that its legal to have no content
        if (fValidate)
        {
            XMLSize_t failure;
            bool res = fValidator->checkContent(elemDecl, 0, 0, &failure);
            if (!res)
            {
                fValidator->emitError
                (
                    XMLValid::ElementNotValidForContent
                    , qnameRawBuf
                    , elemDecl->getFormattedContentModel()
                );
            }
        }

        // Pop the element stack back off since it'll never be used now
        fElemStack.popTop();

        // If the elem stack is empty, then it was an empty root
        if (isRoot)
            gotData = false;
    }

    return true;
}